

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLineParser.cpp
# Opt level: O2

bool __thiscall
SGParser::Generator::Yacc::CmdLineParseHandler::GetOptionParam
          (CmdLineParseHandler *this,String *optionName,String *paramName,String *dest)

{
  const_iterator cVar1;
  const_iterator cVar2;
  
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::Yacc::CmdLineOption>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::Yacc::CmdLineOption>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->Options)._M_h,optionName);
  if ((cVar1.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::Yacc::CmdLineOption>,_true>
       ._M_cur != (__node_type *)0x0) &&
     (cVar2 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::Yacc::CmdLineParam>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::Yacc::CmdLineParam>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::Yacc::CmdLineParam>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::Yacc::CmdLineParam>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)((long)cVar1.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::Yacc::CmdLineOption>,_true>
                               ._M_cur + 0x48),paramName),
     cVar2.
     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::Yacc::CmdLineParam>,_true>
     ._M_cur != (__node_type *)0x0)) {
    std::__cxx11::string::_M_assign((string *)dest);
    return true;
  }
  return false;
}

Assistant:

bool CmdLineParseHandler::GetOptionParam(const String& optionName, const String& paramName,
                                         String& dest) const {
    // If the option exists then try to find the parameter
    if (const auto ioption = Options.find(optionName); ioption != Options.end()) {
        const auto& poption = ioption->second;
        // If the parameter exists then set the destination to its value and return success
        if (const auto iparam = poption.Params.find(paramName); iparam != poption.Params.end()) {
            dest = iparam->second.Value;
            return true;
        }
    }
    return false;
}